

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O3

int format_number(int64_t v,char *p,int s,int maxsize,int strict)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte *pbVar4;
  long lVar5;
  
  if (strict == 0) {
    if (s <= maxsize && -1 < v) {
      lVar5 = 1L << ((char)s * '\x03' & 0x3fU);
      do {
        if (v < lVar5) goto LAB_0015b73a;
        s = s + 1;
        lVar5 = lVar5 << 3;
      } while (maxsize + 1 != s);
    }
    pbVar4 = (byte *)(p + (uint)maxsize);
    if (maxsize < 1) {
      bVar3 = *pbVar4;
    }
    else {
      uVar2 = maxsize + 1;
      do {
        bVar3 = (byte)v;
        pbVar4[-1] = bVar3;
        pbVar4 = pbVar4 + -1;
        v = v >> 8;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    *pbVar4 = bVar3 | 0x80;
    return 0;
  }
LAB_0015b73a:
  iVar1 = format_octal(v,p,s);
  return iVar1;
}

Assistant:

static int
format_number(int64_t v, char *p, int s, int maxsize)
{
	int64_t limit = ((int64_t)1 << (s*3));

	if (v < limit)
		return (format_octal(v, p, s));
	return (format_256(v, p, maxsize));
}